

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logmath.c
# Opt level: O2

int32 logmath_write(logmath_t *lmath,char *file_name)

{
  byte bVar1;
  uint uVar2;
  int32 iVar3;
  uint uVar4;
  FILE *__s;
  long lVar5;
  ulong uVar6;
  char *fmt;
  uint32 chksum;
  
  if ((lmath->t).table == (void *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
            ,0x118,"No log table to write!\n");
    return -1;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
          ,0x11c,"Writing log table file \'%s\'\n");
  __s = fopen(file_name,"wb");
  if (__s == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
                   ,0x11e,"Failed to open logtable file \'%s\' for writing",file_name);
    return -1;
  }
  fwrite("s3\nversion 1.0\nchksum0 yes\n",0x1b,1,__s);
  fprintf(__s,"width %d\n",(ulong)(lmath->t).width);
  fprintf(__s,"shift %d\n",(ulong)(uint)(int)(lmath->t).shift);
  fprintf(__s,"logbase %f\n",lmath->base);
  lVar5 = ftell(__s);
  bVar1 = (lmath->t).width;
  uVar6 = (ulong)bVar1 - 1 & lVar5 + 7U;
  if (uVar6 != 0) {
    if (8 < bVar1) {
      __assert_fail("lmath->t.width <= 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
                    ,300,"int32 logmath_write(logmath_t *, const char *)");
    }
    fwrite("        ",1,bVar1 - uVar6,__s);
  }
  fwrite("endhdr\n",7,1,__s);
  chksum = 0x11223344;
  fwrite(&chksum,4,1,__s);
  chksum = 0;
  iVar3 = bio_fwrite(&(lmath->t).table_size,4,1,(FILE *)__s,0,&chksum);
  if (iVar3 == 1) {
    uVar4 = bio_fwrite((lmath->t).table,(uint)(lmath->t).width,(lmath->t).table_size,(FILE *)__s,0,
                       &chksum);
    uVar2 = (lmath->t).table_size;
    if (uVar4 != uVar2) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
              ,0x13f,"Failed to write data (%d x %d bytes) to the file \'%s\'",(ulong)uVar2,
              (ulong)(lmath->t).width,file_name);
      goto LAB_0010cf7a;
    }
    iVar3 = bio_fwrite(&chksum,4,1,(FILE *)__s,0,(uint32 *)0x0);
    if (iVar3 == 1) {
      fclose(__s);
      return 0;
    }
    fmt = "Failed to write checksum to the file \'%s\'";
    lVar5 = 0x143;
  }
  else {
    fmt = "Failed to write data to a file \'%s\'";
    lVar5 = 0x138;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
          ,lVar5,fmt,file_name);
LAB_0010cf7a:
  fclose(__s);
  return -1;
}

Assistant:

int32
logmath_write(logmath_t *lmath, const char *file_name)
{
    FILE *fp;
    long pos;
    uint32 chksum;

    if (lmath->t.table == NULL) {
        E_ERROR("No log table to write!\n");
        return -1;
    }

    E_INFO("Writing log table file '%s'\n", file_name);
    if ((fp = fopen(file_name, "wb")) == NULL) {
        E_ERROR_SYSTEM("Failed to open logtable file '%s' for writing", file_name);
        return -1;
    }

    /* For whatever reason, we have to do this manually at the
     * moment. */
    fprintf(fp, "s3\nversion 1.0\nchksum0 yes\n");
    fprintf(fp, "width %d\n", lmath->t.width);
    fprintf(fp, "shift %d\n", lmath->t.shift);
    fprintf(fp, "logbase %f\n", lmath->base);
    /* Pad it out to ensure alignment. */
    pos = ftell(fp) + strlen("endhdr\n");
    if (pos & ((long)lmath->t.width - 1)) {
        size_t align = lmath->t.width - (pos & ((long)lmath->t.width - 1));
        assert(lmath->t.width <= 8);
        fwrite("        " /* 8 spaces */, 1, align, fp);
    }
    fprintf(fp, "endhdr\n");

    /* Now write the binary data. */
    chksum = (uint32)BYTE_ORDER_MAGIC;
    fwrite(&chksum, sizeof(uint32), 1, fp);
    chksum = 0;
    /* #Values to follow */
    if (bio_fwrite(&lmath->t.table_size, sizeof(uint32),
                   1, fp, 0, &chksum) != 1) {
        E_ERROR("Failed to write data to a file '%s'", file_name);
        goto error_out;
    }

    if ((uint32)bio_fwrite(lmath->t.table, lmath->t.width, lmath->t.table_size,
                   fp, 0, &chksum) != lmath->t.table_size) {
        E_ERROR("Failed to write data (%d x %d bytes) to the file '%s'",
                lmath->t.table_size, lmath->t.width, file_name);
        goto error_out;
    }
    if (bio_fwrite(&chksum, sizeof(uint32), 1, fp, 0, NULL) != 1) {
        E_ERROR("Failed to write checksum to the file '%s'", file_name);
        goto error_out;
    }

    fclose(fp);
    return 0;

error_out:
    fclose(fp);
    return -1;
}